

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_25890::StringImportResolver::~StringImportResolver(StringImportResolver *this)

{
  StringImportResolver *this_local;
  
  ~StringImportResolver(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit StringImportResolver(const std::string &ccs) : ccs(ccs) {}